

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.hpp
# Opt level: O2

type setMDPenum<GMXMDP::PullGeom>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>_>
                *str2enum,string *str,PullGeom *optval)

{
  const_iterator cVar1;
  MDP_Exception *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>_>
          ::find(&str2enum->_M_t,str);
  if ((_Rb_tree_header *)cVar1._M_node != &(str2enum->_M_t)._M_impl.super__Rb_tree_header) {
    *optval = cVar1._M_node[2]._M_color;
    return;
  }
  this = (MDP_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Can\'t find enum for string: \'",str);
  std::operator+(&local_60,&local_40,"\'");
  MDP_Exception::MDP_Exception(this,&local_60);
  __cxa_throw(this,&MDP_Exception::typeinfo,General_Exception::~General_Exception);
}

Assistant:

typename enable_if<std::is_enum<T>::value, void>::type
setMDPenum(const map<string, T>& str2enum, const string& str, T& optval) {
  const typename map<string,T>::const_iterator it = str2enum.find(str);
  if(it == str2enum.end()) {
    throw(MDP_Exception("Can't find enum for string: '"+str+"'"));
  }
  optval = it->second;
}